

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O1

void __thiscall
NavierStokesBase::manual_tags_placement
          (NavierStokesBase *this,TagBoxArray *tags,
          Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *bf_lev)

{
  int *piVar1;
  int iVar2;
  pointer pIVar3;
  Amr *pAVar4;
  pointer pIVar5;
  long lVar6;
  undefined8 uVar7;
  pointer pOVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  BATType BVar19;
  long lVar20;
  long lVar21;
  int dir;
  long lVar22;
  Box result;
  IntVect hi;
  Box outflowBox;
  Vector<amrex::Orientation,_std::allocator<amrex::Orientation>_> outFaces;
  IntVect low;
  undefined8 local_128;
  IndexType IStack_120;
  uint auStack_11c [2];
  undefined8 uStack_114;
  BATType local_100 [4];
  Box local_f0;
  TagBoxArray *local_d0;
  ulong local_c8;
  uint local_c0;
  Vector<amrex::Orientation,_std::allocator<amrex::Orientation>_> local_b8;
  BoxArray local_a0;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *local_38;
  
  local_b8.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
  super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
  super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
  super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0 = tags;
  local_38 = bf_lev;
  getOutFlowFaces(this,&local_b8);
  if ((local_b8.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
       super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl.
       super__Vector_impl_data._M_finish !=
       local_b8.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
       super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl.
       super__Vector_impl_data._M_start &&
       -1 < (long)local_b8.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                  super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_b8.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                  super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                  _M_impl.super__Vector_impl_data._M_start) &&
     (local_b8.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
      super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_b8.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
      super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl.
      super__Vector_impl_data._M_start &&
      -1 < (long)local_b8.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                 super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)local_b8.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                 super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl
                 .super__Vector_impl_data._M_start)) {
    lVar21 = 0;
    do {
      pOVar8 = local_b8.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
               super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar13 = local_b8.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
               super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl.
               super__Vector_impl_data._M_start[lVar21].val;
      uVar15 = (this->super_AmrLevel).level;
      pIVar3 = (local_38->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
               super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
               super__Vector_impl_data._M_start;
      pIVar5 = pIVar3 + (int)uVar15;
      lVar22 = *(long *)(this->super_AmrLevel).geom.domain.smallend.vect;
      lVar20 = *(long *)((this->super_AmrLevel).geom.domain.smallend.vect + 2);
      lVar6 = *(long *)(this->super_AmrLevel).geom.domain.bigend.vect;
      uVar7 = *(undefined8 *)((this->super_AmrLevel).geom.domain.bigend.vect + 2);
      auStack_11c[1] = (uint)((ulong)lVar6 >> 0x20);
      uStack_114 = uVar7;
      IStack_120.itype = (uint)lVar20;
      auStack_11c[0] = (uint)((ulong)lVar20 >> 0x20);
      iVar12 = pIVar5->vect[0];
      iVar11 = pIVar5->vect[1];
      if ((iVar11 != 1 || iVar12 != 1) || (local_128 = lVar22, pIVar5->vect[2] != 1)) {
        local_128._0_4_ = (uint)lVar22;
        if (iVar12 != 1) {
          if (iVar12 == 4) {
            if ((int)(uint)local_128 < 0) {
              local_128._0_4_ = (uint)local_128 + 1;
              uVar17 = -(uint)local_128;
              if (0 < (int)(uint)local_128) {
                uVar17 = (uint)local_128;
              }
              uVar17 = uVar17 >> 2;
LAB_00344cf2:
              local_128._0_4_ = ~uVar17;
            }
            else {
              local_128._0_4_ = (uint)local_128 >> 2;
            }
          }
          else if (iVar12 == 2) {
            if ((int)(uint)local_128 < 0) {
              local_128._0_4_ = (uint)local_128 + 1;
              uVar17 = -(uint)local_128;
              if (0 < (int)(uint)local_128) {
                uVar17 = (uint)local_128;
              }
              uVar17 = uVar17 >> 1;
              goto LAB_00344cf2;
            }
            local_128._0_4_ = (uint)local_128 >> 1;
          }
          else if ((int)(uint)local_128 < 0) {
            iVar16 = (uint)local_128 + 1;
            iVar2 = -iVar16;
            if (0 < iVar16) {
              iVar2 = iVar16;
            }
            local_128._0_4_ = ~(iVar2 / iVar12);
          }
          else {
            local_128._0_4_ = (int)(uint)local_128 / iVar12;
          }
        }
        local_128._4_4_ = (uint)((ulong)lVar22 >> 0x20);
        if (iVar11 != 1) {
          if (iVar11 == 4) {
            if (lVar22 < 0) {
              local_128._4_4_ = local_128._4_4_ + 1;
              uVar17 = -local_128._4_4_;
              if (0 < (int)local_128._4_4_) {
                uVar17 = local_128._4_4_;
              }
              uVar17 = uVar17 >> 2;
LAB_00344d55:
              local_128._4_4_ = ~uVar17;
            }
            else {
              local_128._4_4_ = local_128._4_4_ >> 2;
            }
          }
          else if (iVar11 == 2) {
            if (lVar22 < 0) {
              local_128._4_4_ = local_128._4_4_ + 1;
              uVar17 = -local_128._4_4_;
              if (0 < (int)local_128._4_4_) {
                uVar17 = local_128._4_4_;
              }
              uVar17 = uVar17 >> 1;
              goto LAB_00344d55;
            }
            local_128._4_4_ = local_128._4_4_ >> 1;
          }
          else if (lVar22 < 0) {
            iVar16 = local_128._4_4_ + 1;
            iVar2 = -iVar16;
            if (0 < iVar16) {
              iVar2 = iVar16;
            }
            local_128._4_4_ = ~(iVar2 / iVar11);
          }
          else {
            local_128._4_4_ = (int)local_128._4_4_ / iVar11;
          }
        }
        iVar2 = pIVar5->vect[2];
        if (iVar2 != 1) {
          if (iVar2 == 4) {
            if ((int)IStack_120.itype < 0) {
              uVar10 = IStack_120.itype + 1;
              uVar17 = -uVar10;
              if (0 < (int)uVar10) {
                uVar17 = uVar10;
              }
              uVar17 = uVar17 >> 2;
LAB_00344dbe:
              IStack_120.itype = ~uVar17;
            }
            else {
              IStack_120.itype = IStack_120.itype >> 2;
            }
          }
          else if (iVar2 == 2) {
            if ((int)IStack_120.itype < 0) {
              uVar10 = IStack_120.itype + 1;
              uVar17 = -uVar10;
              if (0 < (int)uVar10) {
                uVar17 = uVar10;
              }
              uVar17 = uVar17 >> 1;
              goto LAB_00344dbe;
            }
            IStack_120.itype = IStack_120.itype >> 1;
          }
          else if ((int)IStack_120.itype < 0) {
            iVar14 = IStack_120.itype + 1;
            iVar16 = -iVar14;
            if (0 < iVar14) {
              iVar16 = iVar14;
            }
            IStack_120.itype = ~(iVar16 / iVar2);
          }
          else {
            IStack_120.itype = IStack_120.itype / iVar2;
          }
        }
        uStack_114._4_4_ = (uint)((ulong)uVar7 >> 0x20);
        uStack_114._0_4_ = (uint)uVar7;
        if (uStack_114._4_4_ == 0) {
          if (iVar12 != 1) {
            if (iVar12 == 4) {
              if (lVar20 < 0) {
                auStack_11c[0] = auStack_11c[0] + 1;
                uVar17 = -auStack_11c[0];
                if (0 < (int)auStack_11c[0]) {
                  uVar17 = auStack_11c[0];
                }
                uVar17 = uVar17 >> 2;
LAB_00345367:
                auStack_11c[0] = ~uVar17;
              }
              else {
                auStack_11c[0] = auStack_11c[0] >> 2;
              }
            }
            else if (iVar12 == 2) {
              if (lVar20 < 0) {
                auStack_11c[0] = auStack_11c[0] + 1;
                uVar17 = -auStack_11c[0];
                if (0 < (int)auStack_11c[0]) {
                  uVar17 = auStack_11c[0];
                }
                uVar17 = uVar17 >> 1;
                goto LAB_00345367;
              }
              auStack_11c[0] = auStack_11c[0] >> 1;
            }
            else if (lVar20 < 0) {
              iVar14 = auStack_11c[0] + 1;
              iVar16 = -iVar14;
              if (0 < iVar14) {
                iVar16 = iVar14;
              }
              auStack_11c[0] = ~(iVar16 / iVar12);
            }
            else {
              auStack_11c[0] = (int)auStack_11c[0] / iVar12;
            }
          }
          if (iVar11 != 1) {
            if (iVar11 == 4) {
              if (lVar6 < 0) {
                auStack_11c[1] = auStack_11c[1] + 1;
                uVar17 = -auStack_11c[1];
                if (0 < (int)auStack_11c[1]) {
                  uVar17 = auStack_11c[1];
                }
                uVar17 = uVar17 >> 2;
LAB_003453cb:
                auStack_11c[1] = ~uVar17;
              }
              else {
                auStack_11c[1] = auStack_11c[1] >> 2;
              }
            }
            else if (iVar11 == 2) {
              if (lVar6 < 0) {
                auStack_11c[1] = auStack_11c[1] + 1;
                uVar17 = -auStack_11c[1];
                if (0 < (int)auStack_11c[1]) {
                  uVar17 = auStack_11c[1];
                }
                uVar17 = uVar17 >> 1;
                goto LAB_003453cb;
              }
              auStack_11c[1] = auStack_11c[1] >> 1;
            }
            else if (lVar6 < 0) {
              iVar16 = auStack_11c[1] + 1;
              iVar12 = -iVar16;
              if (0 < iVar16) {
                iVar12 = iVar16;
              }
              auStack_11c[1] = ~(iVar12 / iVar11);
            }
            else {
              auStack_11c[1] = (int)auStack_11c[1] / iVar11;
            }
          }
          if (iVar2 != 1) {
            if (iVar2 == 4) {
              if ((int)(uint)uStack_114 < 0) {
                uStack_114._0_4_ = (uint)uStack_114 + 1;
                uVar17 = -(uint)uStack_114;
                if (0 < (int)(uint)uStack_114) {
                  uVar17 = (uint)uStack_114;
                }
                uVar17 = uVar17 >> 2;
LAB_0034543d:
                uStack_114._0_4_ = ~uVar17;
              }
              else {
                uStack_114._0_4_ = (uint)uStack_114 >> 2;
              }
            }
            else if (iVar2 == 2) {
              if ((int)(uint)uStack_114 < 0) {
                uStack_114._0_4_ = (uint)uStack_114 + 1;
                uVar17 = -(uint)uStack_114;
                if (0 < (int)(uint)uStack_114) {
                  uVar17 = (uint)uStack_114;
                }
                uVar17 = uVar17 >> 1;
                goto LAB_0034543d;
              }
              uStack_114._0_4_ = (uint)uStack_114 >> 1;
            }
            else if ((int)(uint)uStack_114 < 0) {
              iVar11 = (uint)uStack_114 + 1;
              iVar12 = -iVar11;
              if (0 < iVar11) {
                iVar12 = iVar11;
              }
              uStack_114._0_4_ = ~(iVar12 / iVar2);
            }
            else {
              uStack_114._0_4_ = (int)(uint)uStack_114 / iVar2;
            }
          }
        }
        else {
          local_a0.m_bat._0_8_ = 0;
          local_a0.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)0;
          lVar22 = 0;
          do {
            if (((uStack_114._4_4_ >> ((uint)lVar22 & 0x1f) & 1) != 0) &&
               ((int)auStack_11c[lVar22] % pIVar5->vect[lVar22] != 0)) {
              (&local_a0.m_bat.m_bat_type)[lVar22] = indexType;
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 != 3);
          if (iVar12 != 1) {
            if (iVar12 == 4) {
              if (lVar20 < 0) {
                auStack_11c[0] = auStack_11c[0] + 1;
                uVar17 = -auStack_11c[0];
                if (0 < (int)auStack_11c[0]) {
                  uVar17 = auStack_11c[0];
                }
                uVar17 = uVar17 >> 2;
LAB_00344ec7:
                auStack_11c[0] = ~uVar17;
              }
              else {
                auStack_11c[0] = auStack_11c[0] >> 2;
              }
            }
            else if (iVar12 == 2) {
              if (lVar20 < 0) {
                auStack_11c[0] = auStack_11c[0] + 1;
                uVar17 = -auStack_11c[0];
                if (0 < (int)auStack_11c[0]) {
                  uVar17 = auStack_11c[0];
                }
                uVar17 = uVar17 >> 1;
                goto LAB_00344ec7;
              }
              auStack_11c[0] = auStack_11c[0] >> 1;
            }
            else if (lVar20 < 0) {
              iVar14 = auStack_11c[0] + 1;
              iVar16 = -iVar14;
              if (0 < iVar14) {
                iVar16 = iVar14;
              }
              auStack_11c[0] = ~(iVar16 / iVar12);
            }
            else {
              auStack_11c[0] = (int)auStack_11c[0] / iVar12;
            }
          }
          if (iVar11 != 1) {
            if (iVar11 == 4) {
              if (lVar6 < 0) {
                auStack_11c[1] = auStack_11c[1] + 1;
                uVar17 = -auStack_11c[1];
                if (0 < (int)auStack_11c[1]) {
                  uVar17 = auStack_11c[1];
                }
                uVar17 = uVar17 >> 2;
LAB_00344f2d:
                auStack_11c[1] = ~uVar17;
              }
              else {
                auStack_11c[1] = auStack_11c[1] >> 2;
              }
            }
            else if (iVar11 == 2) {
              if (lVar6 < 0) {
                auStack_11c[1] = auStack_11c[1] + 1;
                uVar17 = -auStack_11c[1];
                if (0 < (int)auStack_11c[1]) {
                  uVar17 = auStack_11c[1];
                }
                uVar17 = uVar17 >> 1;
                goto LAB_00344f2d;
              }
              auStack_11c[1] = auStack_11c[1] >> 1;
            }
            else if (lVar6 < 0) {
              iVar16 = auStack_11c[1] + 1;
              iVar12 = -iVar16;
              if (0 < iVar16) {
                iVar12 = iVar16;
              }
              auStack_11c[1] = ~(iVar12 / iVar11);
            }
            else {
              auStack_11c[1] = (int)auStack_11c[1] / iVar11;
            }
          }
          if (iVar2 != 1) {
            if (iVar2 == 4) {
              if ((int)(uint)uStack_114 < 0) {
                uStack_114._0_4_ = (uint)uStack_114 + 1;
                uVar17 = -(uint)uStack_114;
                if (0 < (int)(uint)uStack_114) {
                  uVar17 = (uint)uStack_114;
                }
                uVar17 = uVar17 >> 2;
LAB_00344f92:
                uStack_114._0_4_ = ~uVar17;
              }
              else {
                uStack_114._0_4_ = (uint)uStack_114 >> 2;
              }
            }
            else if (iVar2 == 2) {
              if ((int)(uint)uStack_114 < 0) {
                uStack_114._0_4_ = (uint)uStack_114 + 1;
                uVar17 = -(uint)uStack_114;
                if (0 < (int)(uint)uStack_114) {
                  uVar17 = (uint)uStack_114;
                }
                uVar17 = uVar17 >> 1;
                goto LAB_00344f92;
              }
              uStack_114._0_4_ = (uint)uStack_114 >> 1;
            }
            else if ((int)(uint)uStack_114 < 0) {
              iVar11 = (uint)uStack_114 + 1;
              iVar12 = -iVar11;
              if (0 < iVar11) {
                iVar12 = iVar11;
              }
              uStack_114._0_4_ = ~(iVar12 / iVar2);
            }
            else {
              uStack_114._0_4_ = (int)(uint)uStack_114 / iVar2;
            }
          }
          auStack_11c[0] = auStack_11c[0] + local_a0.m_bat.m_bat_type;
          auStack_11c[1] = auStack_11c[1] + (int)local_a0.m_bat.m_op.m_indexType.m_typ.itype;
          uStack_114._0_4_ = (uint)uStack_114 + (int)local_a0.m_bat.m_op.m_bndryReg.m_typ.itype;
        }
      }
      uVar17 = iVar13 % 3;
      if (do_refine_outflow == 0) {
        if (do_derefine_outflow != 0) {
          lVar22 = (long)(int)uVar17;
          iVar13 = pIVar3->vect[lVar22];
          iVar12 = (Nbuf_outflow / iVar13 + 1) - (uint)(Nbuf_outflow % iVar13 == 0);
          if (0 < (int)uVar15) {
            pAVar4 = (this->super_AmrLevel).parent;
            iVar13 = iVar12 * iVar13;
            pIVar5 = (pAVar4->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio.
                     super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                     super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar20 = 0;
            do {
              local_a0.m_bat._0_8_ = *(long *)((long)pIVar5->vect + lVar20);
              local_a0.m_bat.m_op.m_bndryReg.m_typ.itype =
                   (IndexType)(IndexType)*(uint *)((long)pIVar5->vect + lVar20 + 8);
              iVar12 = iVar13 * (&local_a0.m_bat.m_bat_type)[lVar22] +
                       (pAVar4->super_AmrCore).super_AmrMesh.super_AmrInfo.n_proper;
              iVar13 = *(int *)((long)pIVar3[1].vect + lVar20 + lVar22 * 4);
              iVar12 = (iVar12 / iVar13 + 1) - (uint)(iVar12 % iVar13 == 0);
              iVar13 = iVar13 * iVar12;
              lVar20 = lVar20 + 0xc;
            } while ((ulong)uVar15 * 0xc != lVar20);
          }
          if (0 < iVar12) {
            uVar15 = local_b8.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                     super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar21].val % 3;
            local_a0.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)(IndexType)IStack_120.itype;
            local_a0.m_bat._0_8_ = local_128;
            local_100[2] = (uint)uStack_114;
            local_100[0] = auStack_11c[0];
            local_100[1] = auStack_11c[1];
            if (local_b8.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl.
                super__Vector_impl_data._M_start[lVar21].val < 3) {
              uVar18 = (ulong)(int)uVar15;
              BVar19 = (&local_a0.m_bat.m_bat_type)[uVar18] - indexType;
            }
            else {
              local_c8 = CONCAT44(uStack_114._4_4_ >> 1,uStack_114._4_4_) & 0x100000001;
              local_c0 = uStack_114._4_4_ >> 2 & 1;
              uVar18 = (ulong)uVar15;
              BVar19 = (~*(uint *)((long)&local_c8 + uVar18 * 4) & 1) + local_100[uVar18];
            }
            (&local_a0.m_bat.m_bat_type)[uVar18] = BVar19;
            local_100[uVar18] = BVar19;
            local_f0.smallend.vect._0_8_ = local_a0.m_bat._0_8_;
            local_f0.smallend.vect[2] = (int)local_a0.m_bat.m_op.m_bndryReg.m_typ.itype;
            local_f0.bigend.vect[2] = local_100[2];
            local_f0.bigend.vect[0] = local_100[0];
            local_f0.bigend.vect[1] = local_100[1];
            local_f0.btype.itype = uStack_114._4_4_ & ~(1 << (uVar15 & 0x1f));
            uVar18 = 0;
            do {
              if (uVar17 != uVar18) {
                piVar1 = local_f0.smallend.vect + uVar18;
                *piVar1 = *piVar1 + -1;
                piVar1 = local_f0.bigend.vect + uVar18;
                *piVar1 = *piVar1 + 1;
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 != 3);
            if (pOVar8[lVar21].val < 3) {
              piVar1 = local_f0.bigend.vect + lVar22;
              *piVar1 = *piVar1 + iVar12;
            }
            else {
              piVar1 = local_f0.smallend.vect + lVar22;
              *piVar1 = *piVar1 - iVar12;
            }
            amrex::BoxArray::BoxArray(&local_a0,&local_f0,1);
            amrex::TagBoxArray::setVal(local_d0,&local_a0,CLEAR);
            goto LAB_00345324;
          }
        }
      }
      else {
        uVar15 = local_b8.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                 super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl
                 .super__Vector_impl_data._M_start[lVar21].val % 3;
        local_a0.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)(IndexType)IStack_120.itype;
        local_a0.m_bat._0_8_ = local_128;
        local_100[2] = (uint)uStack_114;
        local_100[0] = auStack_11c[0];
        local_100[1] = auStack_11c[1];
        if (local_b8.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
            super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl.
            super__Vector_impl_data._M_start[lVar21].val < 3) {
          uVar18 = (ulong)(int)uVar15;
          BVar19 = (&local_a0.m_bat.m_bat_type)[uVar18] - indexType;
        }
        else {
          local_c8 = CONCAT44(uStack_114._4_4_ >> 1,uStack_114._4_4_) & 0x100000001;
          local_c0 = uStack_114._4_4_ >> 2 & 1;
          uVar18 = (ulong)uVar15;
          BVar19 = (~*(uint *)((long)&local_c8 + uVar18 * 4) & 1) + local_100[uVar18];
        }
        (&local_a0.m_bat.m_bat_type)[uVar18] = BVar19;
        local_100[uVar18] = BVar19;
        iVar13 = (uint)(iVar13 < 3) * 2 + -1;
        local_f0.smallend.vect._0_8_ = local_a0.m_bat._0_8_;
        local_f0.smallend.vect[2] = (int)local_a0.m_bat.m_op.m_bndryReg.m_typ.itype;
        local_f0.bigend.vect[2] = local_100[2];
        local_f0.bigend.vect[0] = local_100[0];
        local_f0.bigend.vect[1] = local_100[1];
        local_f0.btype.itype = uStack_114._4_4_ & ~(1 << (uVar15 & 0x1f));
        piVar1 = local_f0.smallend.vect + (int)uVar17;
        *piVar1 = *piVar1 + iVar13;
        piVar1 = local_f0.bigend.vect + (int)uVar17;
        *piVar1 = *piVar1 + iVar13;
        bVar9 = amrex::TagBoxArray::hasTags(local_d0,&local_f0);
        if (bVar9) {
          amrex::BoxArray::BoxArray(&local_a0,&local_f0,1);
          amrex::TagBoxArray::setVal(local_d0,&local_a0,SET);
LAB_00345324:
          amrex::BoxArray::~BoxArray(&local_a0);
        }
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 < (long)local_b8.
                            super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                            super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_b8.
                            super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                            super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2);
  }
  if (local_b8.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
      super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                    super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                          super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super_vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>.
                          super__Vector_base<amrex::Orientation,_std::allocator<amrex::Orientation>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
NavierStokesBase::manual_tags_placement (TagBoxArray&    tags,
                                         const Vector<IntVect>& bf_lev)
{
    Vector<Orientation> outFaces;
    getOutFlowFaces(outFaces);
    if (outFaces.size()>0)
    {
        for (int i=0; i<outFaces.size(); ++i)
        {
            const Orientation& outFace = outFaces[i];
            const int oDir = outFace.coordDir();
            const Box& crse_domain = amrex::coarsen(geom.Domain(),bf_lev[level]);
            const int mult = (outFace.isLow() ? +1 : -1);
            if (do_refine_outflow)
            {
                //
                // Refine entire outflow boundary if new boxes within grid_tol
                // from outflow
                //
                const int grid_tol = 1;

                Box outflowBox = amrex::adjCell(crse_domain,outFace,grid_tol);

                outflowBox.shift(oDir,mult*grid_tol);

                //
                // Only refine if there are already tagged cells in the outflow
                // region
                //
                bool hasTags = tags.hasTags(outflowBox);
                if (hasTags)
                    tags.setVal(BoxArray(&outflowBox,1),TagBox::SET);
                }
            else if (do_derefine_outflow)
            {
                const int np = parent->nProper();
                //
                // Calculate the number of level 0 cells to be left uncovered
                // at the outflow.  The convoluted logic allows for the fact that
                // the number of uncovered cells must be a multiple of the level
                // blocking factor.  So, when calculating the number of coarse
                // cells below, we always round the division up.
                //
                int N_coarse_cells = Nbuf_outflow / bf_lev[0][oDir];
                if (Nbuf_outflow % bf_lev[0][oDir] != 0)
                    N_coarse_cells++;

                int N_level_cells = N_coarse_cells * bf_lev[0][oDir];

                //
                // Adjust this to get the number of cells to be left uncovered at
                // levels higher than 0
                //
                for (int j = 1; j <= level; ++j)
                {
                    /*** Calculate the minimum cells at this level ***/

                    const int rat = (parent->refRatio(j-1))[oDir];
                    N_level_cells = N_level_cells * rat + np;

                    /*** Calculate the required number of coarse cells ***/

                    N_coarse_cells = N_level_cells / bf_lev[j][oDir];
                    if (N_level_cells % bf_lev[j][oDir] != 0)
                        N_coarse_cells++;

                    /*** Calculate the corresponding number of level cells ***/

                    N_level_cells = N_coarse_cells * bf_lev[j][oDir];
                }
                //
                // Untag the cells near the outflow
                //
                if (N_coarse_cells > 0)
                {
                    //
                    // Generate box at the outflow and grow it in all directions
                    // other than the outflow.  This forces outflow cells in the
                    // ghostcells in directions other that oDir to be cleared.
                    //
                    Box outflowBox = amrex::adjCell(crse_domain, outFace, 1);
                    for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
                        if (dir != oDir) outflowBox.grow(dir, 1);
                    //
                    // Now, grow the box into the domain (opposite direction as
                    // outFace) the number of cells we need to clear.
                    //
                    if (outFace.isLow())
                        outflowBox.growHi(oDir, N_coarse_cells);
                    else
                        outflowBox.growLo(oDir, N_coarse_cells);

                    tags.setVal(BoxArray(&outflowBox,1),TagBox::CLEAR);
                }
            }
        }
    }
}